

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag.cpp
# Opt level: O0

string * __thiscall Command::commandWithoutDefaultArgs(Command *this,string *args)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  
  std::operator+(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  std::operator+(in_stack_ffffffffffffffc8,in_RDI);
  std::__cxx11::string::~string(in_RDI);
  return in_RDI;
}

Assistant:

[[nodiscard]] std::string
  commandWithoutDefaultArgs(const std::string &args) const {
    return cmd_ + " " + args;
  }